

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_starts_with(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                     lys_module *param_4,lyxp_set *set,int options)

{
  lyxp_set *set_00;
  int iVar1;
  int iVar2;
  lys_node *plVar3;
  size_t __n;
  char *pcVar4;
  char *pcVar5;
  ly_ctx *plVar6;
  
  set_00 = *args;
  if ((options & 0x1cU) == 0) {
    iVar2 = lyxp_set_cast(set_00,LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar2 != 0) {
      return -1;
    }
    pcVar4 = ((*args)->val).str;
    pcVar5 = (args[1]->val).str;
    __n = strlen(pcVar5);
    iVar2 = strncmp(pcVar4,pcVar5,__n);
    if (iVar2 != 0) {
      set_fill_boolean(set,0);
      return 0;
    }
    set_fill_boolean(set,1);
    return 0;
  }
  iVar2 = 0;
  if ((set_00->type == LYXP_SET_SNODE_SET) &&
     (plVar3 = warn_get_snode_in_ctx(set_00), plVar3 != (lys_node *)0x0)) {
    if ((plVar3->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar6 = param_4->ctx;
      pcVar4 = strnodetype(plVar3->nodetype);
      pcVar5 = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      iVar1 = warn_is_string_type((lys_type *)&plVar3[1].ref);
      if (iVar1 != 0) goto LAB_0017929e;
      plVar6 = param_4->ctx;
      pcVar4 = plVar3->name;
      pcVar5 = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
    iVar2 = 1;
    ly_log(plVar6,LY_LLWRN,LY_SUCCESS,pcVar5,"xpath_starts_with",pcVar4);
  }
LAB_0017929e:
  if ((args[1]->type == LYXP_SET_SNODE_SET) &&
     (plVar3 = warn_get_snode_in_ctx(args[1]), plVar3 != (lys_node *)0x0)) {
    if ((plVar3->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar6 = param_4->ctx;
      pcVar4 = strnodetype(plVar3->nodetype);
      pcVar5 = "Argument #2 of %s is a %s node \"%s\".";
    }
    else {
      iVar1 = warn_is_string_type((lys_type *)&plVar3[1].ref);
      if (iVar1 != 0) goto LAB_00179322;
      plVar6 = param_4->ctx;
      pcVar4 = plVar3->name;
      pcVar5 = "Argument #2 of %s is node \"%s\", not of string-type.";
    }
    iVar2 = 1;
    ly_log(plVar6,LY_LLWRN,LY_SUCCESS,pcVar5,"xpath_starts_with",pcVar4);
  }
LAB_00179322:
  set_snode_clear_ctx(set);
  return iVar2;
}

Assistant:

static int
xpath_starts_with(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                  struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    if (strncmp(args[0]->val.str, args[1]->val.str, strlen(args[1]->val.str))) {
        set_fill_boolean(set, 0);
    } else {
        set_fill_boolean(set, 1);
    }

    return EXIT_SUCCESS;
}